

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

QString * __thiscall
QUrlQuery::queryItemValue
          (QString *__return_storage_ptr__,QUrlQuery *this,QString *key,
          ComponentFormattingOptions encoding)

{
  QUrlQueryPrivate *pQVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QUrlQueryPrivate *)0x0) {
    cVar4 = QUrlQueryPrivate::findKey(pQVar1,key);
    pQVar1 = (this->d).d.ptr;
    if (cVar4.i != (pQVar1->itemList).d.ptr + (pQVar1->itemList).d.size) {
      QUrlQueryPrivate::recodeToUser(&local_38,pQVar1,&(cVar4.i)->second,encoding);
      data = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_38.d.d;
      (__return_storage_ptr__->d).ptr = local_38.d.ptr;
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlQuery::queryItemValue(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QString result;
    if (d) {
        Map::const_iterator it = d->findKey(key);
        if (it != d->itemList.constEnd())
            result = d->recodeToUser(it->second, encoding);
    }
    return result;
}